

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-common.cc
# Opt level: O0

Dim * __thiscall
cnn::L1Distance::dim_forward(L1Distance *this,vector<cnn::Dim,_std::allocator<cnn::Dim>_> *xs)

{
  initializer_list<unsigned_int> x;
  bool bVar1;
  size_type sVar2;
  invalid_argument *this_00;
  const_reference pvVar3;
  vector<cnn::Dim,_std::allocator<cnn::Dim>_> *in_RDX;
  Dim *in_RDI;
  ostringstream s;
  Dim *in_stack_fffffffffffffda8;
  Dim *in_stack_fffffffffffffdb0;
  uint *__a;
  vector<cnn::Dim,_std::allocator<cnn::Dim>_> *in_stack_fffffffffffffdb8;
  ostringstream *this_01;
  undefined8 in_stack_fffffffffffffdc8;
  uint b;
  Dim *pDVar4;
  undefined4 in_stack_fffffffffffffde0;
  undefined4 uVar5;
  string local_200 [48];
  ostringstream local_1d0 [448];
  vector<cnn::Dim,_std::allocator<cnn::Dim>_> *local_10;
  
  b = (uint)((ulong)in_stack_fffffffffffffdc8 >> 0x20);
  pDVar4 = in_RDI;
  local_10 = in_RDX;
  sVar2 = std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::size(in_RDX);
  if (sVar2 != 2) {
    __assert_fail("xs.size() == 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/cnn/nodes-common.cc"
                  ,0x317,"virtual Dim cnn::L1Distance::dim_forward(const vector<Dim> &) const");
  }
  std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::operator[](local_10,0);
  Dim::single_batch(in_stack_fffffffffffffdb0);
  std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::operator[](local_10,1);
  Dim::single_batch(in_stack_fffffffffffffdb0);
  bVar1 = cnn::operator!=(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  if (!bVar1) {
    uVar5 = 1;
    pvVar3 = std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::operator[](local_10,0);
    __a = &pvVar3->bd;
    pvVar3 = std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::operator[](local_10,1);
    std::max<unsigned_int>(__a,&pvVar3->bd);
    x._M_len._0_4_ = in_stack_fffffffffffffde0;
    x._M_array = pDVar4->d;
    x._M_len._4_4_ = uVar5;
    Dim::Dim(in_RDI,x,b);
    return pDVar4;
  }
  this_01 = local_1d0;
  std::__cxx11::ostringstream::ostringstream(this_01);
  std::operator<<((ostream *)this_01,"Mismatched input dimensions in L1Distance: ");
  cnn::operator<<((ostream *)this_01,in_stack_fffffffffffffdb8);
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::__cxx11::ostringstream::str();
  std::invalid_argument::invalid_argument(this_00,local_200);
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

Dim L1Distance::dim_forward(const vector<Dim>& xs) const {
  assert(xs.size() == 2);
  if (xs[0].single_batch() != xs[1].single_batch()) {
    ostringstream s; s << "Mismatched input dimensions in L1Distance: " << xs;
    throw std::invalid_argument(s.str());
  }
  return Dim({1}, max(xs[0].bd, xs[1].bd));
}